

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitParam.hpp
# Opt level: O0

void __thiscall
rc::detail::ImplicitParam<rc::detail::param::CurrentPropertyContext>::ImplicitParam
          (ImplicitParam<rc::detail::param::CurrentPropertyContext> *this,ValueType value)

{
  size_type local_30;
  pair<rc::detail::PropertyContext_*,_unsigned_long> local_28;
  ValueType local_18;
  ValueType value_local;
  ImplicitParam<rc::detail::param::CurrentPropertyContext> *this_local;
  
  local_18 = value;
  value_local = (ValueType)this;
  local_30 = std::
             stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
             ::size((stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
                     *)ImplicitScope::m_scopes);
  local_28 = std::make_pair<rc::detail::PropertyContext*,unsigned_long>(&local_18,&local_30);
  std::
  stack<std::pair<rc::detail::PropertyContext_*,_unsigned_long>,_std::vector<std::pair<rc::detail::PropertyContext_*,_unsigned_long>,_std::allocator<std::pair<rc::detail::PropertyContext_*,_unsigned_long>_>_>_>
  ::push((stack<std::pair<rc::detail::PropertyContext_*,_unsigned_long>,_std::vector<std::pair<rc::detail::PropertyContext_*,_unsigned_long>,_std::allocator<std::pair<rc::detail::PropertyContext_*,_unsigned_long>_>_>_>
          *)m_stack,&local_28);
  return;
}

Assistant:

ImplicitParam<Param>::ImplicitParam(ValueType value) {
  m_stack.push(
      std::make_pair(std::move(value), ImplicitScope::m_scopes.size()));
}